

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_138c18::SQLiteBuildDB::SQLiteBuildDB
          (SQLiteBuildDB *this,StringRef path,uint32_t clientSchemaVersion,
          bool recreateOnUnmatchedVersion)

{
  bool recreateOnUnmatchedVersion_local;
  uint32_t clientSchemaVersion_local;
  SQLiteBuildDB *this_local;
  StringRef path_local;
  
  path_local.Data = (char *)path.Length;
  this_local = (SQLiteBuildDB *)path.Data;
  llbuild::core::BuildDB::BuildDB(&this->super_BuildDB);
  (this->super_BuildDB)._vptr_BuildDB = (_func_int **)&PTR__SQLiteBuildDB_0038f558;
  llvm::StringRef::operator_cast_to_string(&this->path,(StringRef *)&this_local);
  this->clientSchemaVersion = clientSchemaVersion;
  this->recreateOnUnmatchedVersion = recreateOnUnmatchedVersion;
  this->db = (sqlite3 *)0x0;
  std::mutex::mutex(&this->dbMutex);
  this->delegate = (BuildDBDelegate *)0x0;
  this->deleteFromKeysStmt = (sqlite3_stmt *)0x0;
  this->findRuleResultStmt = (sqlite3_stmt *)0x0;
  this->fastFindRuleResultStmt = (sqlite3_stmt *)0x0;
  this->getKeysWithResultStmt = (sqlite3_stmt *)0x0;
  this->insertIntoRuleResultsStmt = (sqlite3_stmt *)0x0;
  this->findKeyIDForKeyStmt = (sqlite3_stmt *)0x0;
  this->findKeyNameForKeyIDStmt = (sqlite3_stmt *)0x0;
  this->insertIntoKeysStmt = (sqlite3_stmt *)0x0;
  llvm::
  DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
  ::DenseMap(&this->engineKeyIDs,0);
  llvm::
  DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
  ::DenseMap(&this->dbKeyIDs,0);
  return;
}

Assistant:

SQLiteBuildDB(StringRef path, uint32_t clientSchemaVersion, bool recreateOnUnmatchedVersion)
    : path(path), clientSchemaVersion(clientSchemaVersion), recreateOnUnmatchedVersion(recreateOnUnmatchedVersion) { }